

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ActivationLinear * __thiscall
CoreML::Specification::ActivationLinear::New(ActivationLinear *this,Arena *arena)

{
  ActivationLinear *this_00;
  
  this_00 = (ActivationLinear *)operator_new(0x20);
  ActivationLinear(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationLinear>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationLinear* ActivationLinear::New(::google::protobuf::Arena* arena) const {
  ActivationLinear* n = new ActivationLinear;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}